

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O2

Alignment * __thiscall
spoa::SisdAlignmentEngine::Affine
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  pointer ppEVar1;
  char cVar2;
  char cVar3;
  AlignmentType AVar4;
  int iVar5;
  pointer ppEVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  Implementation *pIVar9;
  Node *pNVar10;
  pointer ppNVar11;
  pointer ppNVar12;
  pointer ppEVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 in_register_00000014;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  uint64_t j_2;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  byte bVar28;
  uint64_t j;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  ulong local_d0;
  uint local_bc;
  int32_t *local_b8;
  SisdAlignmentEngine *local_b0;
  ulong local_a8;
  uint local_a0;
  uint32_t local_9c;
  ulong local_98;
  Node *local_90;
  ulong local_88;
  AlignmentType local_7c;
  Graph *local_78;
  int32_t *local_70;
  Implementation *local_68;
  int32_t *local_60;
  pointer local_58;
  ulong local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  local_50 = CONCAT44(in_register_00000014,sequence_len);
  AVar4 = (this->super_AlignmentEngine).type_;
  uVar19 = (ulong)(sequence_len + 1);
  uVar16 = 0x80000400;
  if (AVar4 == kSW) {
    uVar16 = 0;
  }
  local_58 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = (int32_t *)CONCAT44(local_b8._4_4_,uVar16);
  local_68 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
  ;
  local_38 = 2 - uVar19;
  ppNVar11 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar29 = 0;
  uVar18 = 0;
  while (uVar30 = uVar18, uVar27 = uVar29, ppNVar12 = ppNVar11, ppNVar12 != local_58) {
    local_90 = *ppNVar12;
    local_88 = *(ulong *)&(local_68->node_id_to_rank).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar13 = (local_90->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar6 = (local_90->inedges).
              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar13 == ppEVar6) {
      uVar29 = 0;
    }
    else {
      uVar29 = (ulong)(*(int *)(local_88 + (ulong)(*ppEVar13)->tail->id * 4) + 1);
    }
    lVar21 = uVar29 * uVar19;
    local_70 = local_68->H;
    piVar7 = local_68->F;
    lVar25 = local_90->code * uVar19 * 4 +
             *(long *)&(local_68->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl;
    local_a0 = *(int *)(local_88 + (ulong)local_90->id * 4) + 1;
    local_48 = local_a0 * uVar19;
    cVar2 = (this->super_AlignmentEngine).e_;
    cVar3 = (this->super_AlignmentEngine).g_;
    for (uVar29 = 1; uVar29 < uVar19; uVar29 = uVar29 + 1) {
      iVar26 = local_70[lVar21 + uVar29] + (int)cVar3;
      iVar22 = piVar7[lVar21 + uVar29] + (int)cVar2;
      if (iVar22 < iVar26) {
        iVar22 = iVar26;
      }
      piVar7[local_48 + uVar29] = iVar22;
      local_70[local_48 + uVar29] = *(int *)(lVar25 + uVar29 * 4) + local_70[lVar21 + (uVar29 - 1)];
    }
    for (uVar29 = 1; uVar29 < (ulong)((long)ppEVar6 - (long)ppEVar13 >> 3);
        uVar29 = (ulong)((int)uVar29 + 1)) {
      cVar2 = (this->super_AlignmentEngine).g_;
      lVar21 = (*(int *)(local_88 + (ulong)ppEVar13[uVar29]->tail->id * 4) + 1) * uVar19;
      cVar3 = (this->super_AlignmentEngine).e_;
      for (uVar18 = 1; uVar18 < uVar19; uVar18 = uVar18 + 1) {
        iVar26 = local_70[lVar21 + uVar18] + (int)cVar2;
        iVar22 = piVar7[lVar21 + uVar18] + (int)cVar3;
        if (iVar22 < iVar26) {
          iVar22 = iVar26;
        }
        if (iVar22 < piVar7[local_48 + uVar18]) {
          iVar22 = piVar7[local_48 + uVar18];
        }
        piVar7[local_48 + uVar18] = iVar22;
        iVar22 = *(int *)(lVar25 + uVar18 * 4) + local_70[lVar21 + (uVar18 - 1)];
        if (iVar22 < local_70[local_48 + uVar18]) {
          iVar22 = local_70[local_48 + uVar18];
        }
        local_70[local_48 + uVar18] = iVar22;
      }
    }
    piVar8 = local_68->E;
    cVar2 = (this->super_AlignmentEngine).g_;
    cVar3 = (this->super_AlignmentEngine).e_;
    uVar29 = uVar27;
    uVar18 = uVar30;
    for (uVar23 = 1; uVar23 < uVar19; uVar23 = uVar23 + 1) {
      uVar14 = local_70[local_48 + (uVar23 - 1)] + (int)cVar2;
      uVar20 = piVar8[local_48 + (uVar23 - 1)] + (int)cVar3;
      if ((int)uVar20 < (int)uVar14) {
        uVar20 = uVar14;
      }
      piVar8[local_48 + uVar23] = uVar20;
      if ((int)uVar20 < piVar7[local_48 + uVar23]) {
        uVar20 = piVar7[local_48 + uVar23];
      }
      if ((int)uVar20 < local_70[local_48 + uVar23]) {
        uVar20 = local_70[local_48 + uVar23];
      }
      local_70[local_48 + uVar23] = uVar20;
      if (AVar4 == kOV) {
        if ((local_90->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (local_90->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
joined_r0x0011ecde:
          if ((int)local_b8 < (int)uVar20) {
            local_b8 = (int32_t *)CONCAT44(local_b8._4_4_,uVar20);
            uVar29 = (ulong)local_a0;
            uVar18 = uVar23 & 0xffffffff;
          }
        }
      }
      else if (AVar4 == kNW) {
        if (((local_38 + uVar23 == 1) &&
            ((local_90->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (local_90->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish)) &&
           ((int)local_b8 < local_70[local_48 + (uVar19 - 1)])) {
          local_b8 = (int32_t *)CONCAT44(local_b8._4_4_,local_70[local_48 + (uVar19 - 1)]);
          uVar29 = (ulong)local_a0;
          uVar18 = local_50;
        }
      }
      else if (AVar4 == kSW) {
        uVar20 = ~((int)uVar20 >> 0x1f) & uVar20;
        local_70[local_48 + uVar23] = uVar20;
        goto joined_r0x0011ecde;
      }
    }
    local_a8 = uVar27;
    local_98 = uVar30;
    local_40 = ppNVar12;
    ppNVar11 = ppNVar12 + 1;
  }
  if ((int)uVar27 == 0 && (int)uVar30 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = (int)local_b8;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar29 = 0;
  local_d0 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = this;
  local_7c = AVar4;
  local_78 = graph;
  local_60 = score;
  do {
    iVar22 = (int)uVar27;
    iVar26 = (int)uVar30;
    uVar18 = uVar30 & 0xffffffff;
    if (AVar4 == kOV) {
      iVar5 = iVar26;
      if (iVar22 == 0) goto LAB_0011f1d6;
joined_r0x0011ed9d:
      if (iVar5 == 0) goto LAB_0011f1d6;
    }
    else {
      if (AVar4 != kNW) {
        if (AVar4 == kSW) {
          iVar5 = ((local_b0->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl)->H[uVar27 * uVar19 + uVar18];
          goto joined_r0x0011ed9d;
        }
LAB_0011f1d6:
        std::
        __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        return __return_storage_ptr__;
      }
      if (iVar22 == 0 && iVar26 == 0) goto LAB_0011f1d6;
    }
    pIVar9 = (local_b0->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    local_70 = (int32_t *)CONCAT44(local_70._4_4_,(int)uVar29);
    piVar7 = pIVar9->H;
    local_b8 = piVar7 + uVar27 * uVar19;
    iVar5 = local_b8[uVar18];
    if ((iVar26 == 0) || (iVar22 == 0)) {
LAB_0011ee9c:
      if (iVar22 != 0) {
        pNVar10 = (local_78->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar22 - 1];
        ppEVar13 = (pNVar10->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar6 = *(pointer *)
                   ((long)&(pNVar10->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl + 8);
        if (ppEVar13 == ppEVar6) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar13)->tail->id * 4) + 1);
        }
        iVar17 = (int)(local_b0->super_AlignmentEngine).e_;
        local_98 = uVar30;
        if (iVar5 == pIVar9->F[uVar23 * uVar19 + uVar18] + iVar17) {
          bVar32 = true;
        }
        else {
          iVar15 = (int)(local_b0->super_AlignmentEngine).g_;
          if (iVar5 == piVar7[uVar23 * uVar19 + uVar18] + iVar15) {
            local_d0 = uVar30 & 0xffffffff;
            uVar29 = uVar23;
            goto LAB_0011efa3;
          }
          local_90 = (Node *)(piVar7 + uVar18);
          uVar24 = 1;
          do {
            if ((ulong)((long)ppEVar6 - (long)ppEVar13 >> 3) <= uVar24) goto LAB_0011eea6;
            uVar23 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar13[uVar24]->tail->id * 4) + 1);
            bVar32 = iVar5 == pIVar9->F[uVar18 + uVar23 * uVar19] + iVar17;
          } while ((!bVar32) &&
                  (uVar24 = (ulong)((int)uVar24 + 1),
                  iVar5 != (&local_90->id)[uVar23 * uVar19] + iVar15));
        }
        local_d0 = uVar30 & 0xffffffff;
        goto LAB_0011efa5;
      }
LAB_0011eea6:
      if (iVar26 == 0) goto LAB_0011efa3;
      bVar31 = iVar5 == (int)(local_b0->super_AlignmentEngine).e_ +
                        pIVar9->E[uVar27 * uVar19 + (uVar18 - 1)];
      if ((bVar31) || (iVar5 == (int)(local_b0->super_AlignmentEngine).g_ + local_b8[uVar18 - 1])) {
        bVar32 = false;
        local_d0 = (ulong)(iVar26 - 1);
        uVar29 = uVar27;
      }
      else {
        bVar32 = false;
        bVar31 = false;
      }
    }
    else {
      pNVar10 = (local_78->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar22 - 1];
      ppEVar13 = (pNVar10->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar6 = *(pointer *)
                 ((long)&(pNVar10->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar13 == ppEVar6) {
        uVar23 = 0;
      }
      else {
        uVar23 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar13)->tail->id * 4) + 1);
      }
      iVar17 = *(int *)(pNVar10->code * uVar19 * 4 +
                        *(long *)&(pIVar9->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar18 * 4
                       );
      uVar20 = iVar26 - 1;
      if (iVar5 != piVar7[uVar23 * uVar19 + (ulong)uVar20] + iVar17) {
        uVar24 = 1;
        do {
          if ((ulong)((long)ppEVar6 - (long)ppEVar13 >> 3) <= uVar24) goto LAB_0011ee9c;
          ppEVar1 = ppEVar13 + uVar24;
          uVar24 = (ulong)((int)uVar24 + 1);
          uVar23 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar1)->tail->id * 4) + 1);
        } while (iVar5 != piVar7[(ulong)uVar20 + uVar23 * uVar19] + iVar17);
      }
      local_d0 = (ulong)uVar20;
      uVar29 = uVar23;
LAB_0011efa3:
      bVar32 = false;
      uVar23 = uVar29;
LAB_0011efa5:
      bVar31 = false;
      uVar29 = uVar23;
    }
    local_bc = 0xffffffff;
    if (iVar22 != (int)uVar29) {
      local_bc = (local_78->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar22 - 1]->id;
    }
    local_9c = iVar26 - 1;
    if (iVar26 == (int)local_d0) {
      local_9c = 0xffffffff;
    }
    local_a8 = uVar27;
    local_88 = uVar18;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_bc,&local_9c);
    uVar30 = local_d0;
    if (bVar31) {
      do {
        local_bc = 0xffffffff;
        uVar20 = (int)uVar30 - 1;
        uVar30 = (ulong)uVar20;
        local_9c = uVar20;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<int,unsigned_int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,(int *)&local_bc,&local_9c);
        piVar7 = ((local_b0->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                 _M_head_impl)->E;
      } while ((int)(local_b0->super_AlignmentEngine).e_ + piVar7[uVar29 * uVar19 + (ulong)uVar20]
               == piVar7[uVar29 * uVar19 + (ulong)uVar20 + 1]);
    }
    else if (bVar32) {
      do {
        pIVar9 = (local_b0->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                 _M_head_impl;
        lVar21 = uVar29 * uVar19;
        pNVar10 = (local_78->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)uVar29 - 1];
        ppEVar13 = (pNVar10->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppEVar13 ==
              *(pointer *)
               ((long)&(pNVar10->inedges).
                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                       ._M_impl + 8)) {
            uVar29 = 0;
            break;
          }
          iVar22 = pIVar9->F[lVar21 + local_d0];
          uVar29 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar13)->tail->id * 4) + 1);
          if (iVar22 == pIVar9->H[uVar29 * uVar19 + local_d0] +
                        (int)(local_b0->super_AlignmentEngine).g_) {
            bVar28 = 1;
            goto LAB_0011f100;
          }
          ppEVar13 = ppEVar13 + 1;
        } while (iVar22 != pIVar9->F[uVar29 * uVar19 + local_d0] +
                           (int)(local_b0->super_AlignmentEngine).e_);
        bVar28 = 0;
LAB_0011f100:
        local_bc = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&pNVar10->id,(int *)&local_bc);
      } while ((bool)(~bVar28 & (int)uVar29 != 0));
    }
    AVar4 = (local_b0->super_AlignmentEngine).type_;
    uVar27 = uVar29;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Affine(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    // update F and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(
          H_pred_row[j] + g_,
          F_pred_row[j] + e_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        H_row[j] = std::max(
            H_row[j],
            H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      H_row[j] = std::max(H_row[j], std::max(F_row[j], E_row[j]));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && (it->outedges.empty())) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                       H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                           H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left = H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                         H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ !=
            pimpl_->E[i * matrix_width + j + 1]) {
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = false;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if ((stop = pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_) ||  // NOLINT
                      pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_) {  // NOLINT
            prev_i = pred_i;
            break;
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;
        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}